

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void __thiscall
BSDFEnergyConservation_OrenNayar_Test::~BSDFEnergyConservation_OrenNayar_Test
          (BSDFEnergyConservation_OrenNayar_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BSDFEnergyConservation, OrenNayar) {
    TestEnergyConservation(
        [](const SurfaceInteraction& si, Allocator alloc) -> BSDF* {
            return alloc.new_object<BSDF>(
                si.wo, si.n, si.shading.n, si.shading.dpdu,
                alloc.new_object<DiffuseBxDF>(SampledSpectrum(1.f), SampledSpectrum(0.),
                                              20));
        },
        "Oren-Nayar sigma 20");
}